

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoeffBasedProduct.h
# Opt level: O0

void __thiscall
Eigen::
CoeffBasedProduct<Eigen::Block<Eigen::Block<Eigen::Matrix<double,2,2,0,2,2>,-1,-1,false>,-1,-1,false>const,Eigen::Block<Eigen::Matrix<double,2,2,0,2,2>const,-1,1,false>const,6>
::
CoeffBasedProduct<Eigen::Block<Eigen::Block<Eigen::Matrix<double,2,2,0,2,2>,_1,_1,false>,_1,_1,false>,Eigen::Block<Eigen::Matrix<double,2,2,0,2,2>const,_1,1,false>>
          (CoeffBasedProduct<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,__1,__1,_false>,_const_Eigen::Block<const_Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,_1,_false>,_6>
           *this,Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,__1,__1,_false>
                 *lhs,Block<const_Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,_1,_false> *rhs)

{
  Index IVar1;
  Index IVar2;
  void *in_RSI;
  Block<const_Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,_1,_false> *in_RDI;
  Block<const_Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,_1,_false> *in_stack_ffffffffffffffc8;
  
  MatrixBase<Eigen::CoeffBasedProduct<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_-1,_-1,_false>,_-1,_-1,_false>,_const_Eigen::Block<const_Eigen::Matrix<double,_2,_2,_0,_2,_2>,_-1,_1,_false>,_6>_>
  ::MatrixBase((MatrixBase<Eigen::CoeffBasedProduct<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,__1,__1,_false>,_const_Eigen::Block<const_Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,_1,_false>,_6>_>
                *)0x2fa532);
  memcpy(in_RDI,in_RSI,0x48);
  Block<const_Eigen::Matrix<double,_2,_2,_0,_2,_2>,_-1,_1,_false>::Block
            (in_RDI,in_stack_ffffffffffffffc8);
  Matrix<double,_-1,_1,_0,_2,_1>::Matrix((Matrix<double,__1,_1,_0,_2,_1> *)0x2fa567);
  IVar1 = MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_-1,_-1,_false>,_-1,_-1,_false>,_0>
          ::cols((MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,__1,__1,_false>,_0>
                  *)0x2fa571);
  IVar2 = MapBase<Eigen::Block<const_Eigen::Matrix<double,_2,_2,_0,_2,_2>,_-1,_1,_false>,_0>::rows
                    ((MapBase<Eigen::Block<const_Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,_1,_false>,_0>
                      *)0x2fa580);
  if (IVar1 != IVar2) {
    __assert_fail("lhs.cols() == rhs.rows() && \"invalid matrix product\" && \"if you wanted a coeff-wise or a dot product use the respective explicit functions\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/jsc723[P]voronoi-remesh/dependencies/eigen/Eigen/src/Core/products/CoeffBasedProduct.h"
                  ,0x9e,
                  "Eigen::CoeffBasedProduct<const Eigen::Block<Eigen::Block<Eigen::Matrix<double, 2, 2>>>, const Eigen::Block<const Eigen::Matrix<double, 2, 2>, -1, 1>, 6>::CoeffBasedProduct(const Lhs &, const Rhs &) [Lhs = const Eigen::Block<Eigen::Block<Eigen::Matrix<double, 2, 2>>>, Rhs = const Eigen::Block<const Eigen::Matrix<double, 2, 2>, -1, 1>, NestingFlags = 6, Lhs = Eigen::Block<Eigen::Block<Eigen::Matrix<double, 2, 2>>>, Rhs = Eigen::Block<const Eigen::Matrix<double, 2, 2>, -1, 1>]"
                 );
  }
  return;
}

Assistant:

inline CoeffBasedProduct(const Lhs& lhs, const Rhs& rhs)
      : m_lhs(lhs), m_rhs(rhs)
    {
      // we don't allow taking products of matrices of different real types, as that wouldn't be vectorizable.
      // We still allow to mix T and complex<T>.
      EIGEN_STATIC_ASSERT((internal::scalar_product_traits<typename Lhs::RealScalar, typename Rhs::RealScalar>::Defined),
        YOU_MIXED_DIFFERENT_NUMERIC_TYPES__YOU_NEED_TO_USE_THE_CAST_METHOD_OF_MATRIXBASE_TO_CAST_NUMERIC_TYPES_EXPLICITLY)
      eigen_assert(lhs.cols() == rhs.rows()
        && "invalid matrix product"
        && "if you wanted a coeff-wise or a dot product use the respective explicit functions");
    }